

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O0

void __thiscall GeneticAlgorithm::resultToFile(GeneticAlgorithm *this)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  reference pPVar4;
  undefined1 local_270 [8];
  Population p;
  iterator __end2;
  iterator __begin2;
  vector<Population,_std::allocator<Population>_> *__range2;
  ostream local_210 [8];
  ofstream myfile;
  GeneticAlgorithm *this_local;
  
  std::ofstream::ofstream
            (local_210,"C:\\Users\\alican\\ClionProjects\\GeneticAlgorithm\\viewer\\results.tsv",
             0x10);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) != 0) {
    poVar3 = std::operator<<(local_210,"Generation");
    poVar3 = std::operator<<(poVar3,"\t");
    poVar3 = std::operator<<(poVar3,"max fitness");
    poVar3 = std::operator<<(poVar3,"\t");
    poVar3 = std::operator<<(poVar3,"min fitness");
    poVar3 = std::operator<<(poVar3,"\t");
    poVar3 = std::operator<<(poVar3,"average fitness");
    std::operator<<(poVar3,"\n");
    __end2 = std::vector<Population,_std::allocator<Population>_>::begin(&this->generations);
    p.chromosomes.super__Vector_base<Chromosome,_std::allocator<Chromosome>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<Population,_std::allocator<Population>_>::end(&this->generations);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Population_*,_std::vector<Population,_std::allocator<Population>_>_>
                                       *)&p.chromosomes.
                                          super__Vector_base<Chromosome,_std::allocator<Chromosome>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar2
          ) {
      pPVar4 = __gnu_cxx::
               __normal_iterator<Population_*,_std::vector<Population,_std::allocator<Population>_>_>
               ::operator*(&__end2);
      Population::Population((Population *)local_270,pPVar4);
      poVar3 = (ostream *)std::ostream::operator<<(local_210,(double)local_270);
      poVar3 = std::operator<<(poVar3,"\t");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,p.minFitness);
      poVar3 = std::operator<<(poVar3,"\t");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,p.maxFitness);
      std::operator<<(poVar3,"\n");
      Population::~Population((Population *)local_270);
      __gnu_cxx::
      __normal_iterator<Population_*,_std::vector<Population,_std::allocator<Population>_>_>::
      operator++(&__end2);
    }
    std::ofstream::close();
  }
  std::ofstream::~ofstream(local_210);
  return;
}

Assistant:

void GeneticAlgorithm::resultToFile() {
    std::ofstream myfile ("C:\\Users\\alican\\ClionProjects\\GeneticAlgorithm\\viewer\\results.tsv");
    if (myfile.is_open())
    {
        myfile << "Generation" << "\t" << "max fitness" << "\t" << "min fitness" << "\t" << "average fitness" << "\n";
        for (auto p : generations){
            myfile << p.minFitness << "\t" << p.maxFitness << "\t" << p.averageFitness << "\n";
        };
        myfile.close();
    }
}